

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_ExtraPoints_Test::TestBody(PhraseTests_ExtraPoints_Test *this)

{
  bool bVar1;
  optional<jhu::thrax::Span> oVar2;
  char *pcVar3;
  Span *pSVar4;
  char *in_RCX;
  char *in_R9;
  string_view sv;
  AssertHelper local_f8;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Message local_c8;
  short local_bc [2];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  _Storage<jhu::thrax::Span,_true> local_42;
  undefined2 local_3e;
  undefined1 auStack_3c [2];
  optional<jhu::thrax::Span> tgt;
  Span src;
  size_t local_30;
  undefined1 local_28 [8];
  Alignment a;
  PhraseTests_ExtraPoints_Test *this_local;
  
  a.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&tgt.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                     super__Optional_payload_base<jhu::thrax::Span>._M_payload + 2),
             "0-0 0-4 2-4 3-3");
  sv._M_str = in_RCX;
  sv._M_len = local_30;
  readAlignment((Alignment *)local_28,stack0xffffffffffffffc8,sv);
  _auStack_3c = 0x10000;
  oVar2 = minimalTargetSpan((Alignment *)local_28,(Span)0x10000);
  local_42 = oVar2.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
             super__Optional_payload_base<jhu::thrax::Span>._M_payload;
  local_3e = oVar2.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
             super__Optional_payload_base<jhu::thrax::Span>._4_2_;
  local_69 = std::optional<jhu::thrax::Span>::has_value
                       ((optional<jhu::thrax::Span> *)&local_42._M_value);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_68,(AssertionResult *)"tgt.has_value()","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(&local_78);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    local_bc[0] = 0;
    local_bc[1] = 0;
    pSVar4 = std::optional<jhu::thrax::Span>::operator->
                       ((optional<jhu::thrax::Span> *)&local_42._M_value);
    testing::internal::EqHelper<true>::Compare<int,short>
              (local_b8,"0",(int *)"tgt->start",local_bc,pSVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x1b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    local_e4 = 5;
    pSVar4 = std::optional<jhu::thrax::Span>::operator->
                       ((optional<jhu::thrax::Span> *)&local_42._M_value);
    testing::internal::EqHelper<false>::Compare<int,short>
              ((EqHelper<false> *)local_e0,"5","tgt->end",&local_e4,&pSVar4->end);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x1c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    gtest_ar.message_.ptr_._4_4_ = 0;
  }
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~vector
            ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)local_28);
  return;
}

Assistant:

TEST(PhraseTests, ExtraPoints) {
  auto a = readAlignment("0-0 0-4 2-4 3-3");
  Span src{0, 1};
  auto tgt = minimalTargetSpan(a, src);
  ASSERT_TRUE(tgt.has_value());
  EXPECT_EQ(0, tgt->start);
  EXPECT_EQ(5, tgt->end);
}